

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

void test_bit_helpers(void)

{
  undefined8 in_RAX;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  log_info("test_bit_helpers","\n");
  test_bit_check('\x02',2,'0');
  test_bit_check('\x02',1,'1');
  test_bit_check('\x02',0,'0');
  test_bit_check('\b',4,'0');
  test_bit_check('\b',3,'1');
  test_bit_check('\b',2,'0');
  uStack_18._0_5_ = CONCAT14(8,(undefined4)uStack_18);
  bit_set_one((byte_t *)((long)&uStack_18 + 4),0);
  test_bit_check(uStack_18._4_1_,0,'1');
  uStack_18._0_6_ = CONCAT15(8,(undefined5)uStack_18);
  bit_set_one((byte_t *)((long)&uStack_18 + 5),7);
  test_bit_check(uStack_18._5_1_,7,'1');
  uStack_18._0_7_ = CONCAT16(9,(undefined6)uStack_18);
  bit_set_zero((byte_t *)((long)&uStack_18 + 6),0);
  test_bit_check(uStack_18._6_1_,0,'0');
  uStack_18._7_1_ = '\t';
  bit_set_zero((byte_t *)((long)&uStack_18 + 7),1);
  test_bit_check(uStack_18._7_1_,1,'0');
  test_bit_copy('\x02','\x01',1,3,2,'\t');
  test_bit_copy('\b','\x01',4,7,4,'A');
  return;
}

Assistant:

void test_bit_helpers() {
    log_info("test_bit_helpers", "\n");
    // 2 = 00000010
    test_bit_check(2, 2, BIT_0);
    test_bit_check(2, 1, BIT_1);
    test_bit_check(2, 0, BIT_0);

    // 8 = 00001000
    test_bit_check(8, 4, BIT_0);
    test_bit_check(8, 3, BIT_1);
    test_bit_check(8, 2, BIT_0);

    // 8 = 00001000
    test_bit_set_one(8, 0, BIT_1);
    test_bit_set_one(8, 7, BIT_1);

    // 9 = 00001001
    test_bit_set_zero(9, 0, BIT_0);
    test_bit_set_zero(9, 1, BIT_0);

    // source 2 = 0000 0010
    // dest   1 = 0000 0001
    // res    9 = 0000 1001
    // copy 10 from source to dest in pos 3
    test_bit_copy(0x02, 0x01, 1, 3, 2, 0x09);

    // source 2 = 0000 1000
    // dest   1 = 0000 0001
    // res    9 = 0100 0001
    // copy 0100 from source to dest in pos 7
    test_bit_copy(0x08, 0x01, 4, 7, 4, 0x41);
}